

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Frame * rw::countCB(Frame *f,void *count)

{
  void *count_local;
  Frame *f_local;
  
  *(int *)count = *count + 1;
  Frame::forAllChildren(f,countCB,count);
  return f;
}

Assistant:

static Frame*
countCB(Frame *f, void *count)
{
	(*(int32*)count)++;
	f->forAllChildren(countCB, count);
	return f;
}